

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

int traverseephemeron(global_State *g,Table *h,int inv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GCObject *o;
  long lVar4;
  long lVar5;
  Node *pNVar6;
  int local_3c;
  
  lVar4 = 1L << (h->lsizenode & 0x3f);
  local_3c = traversearray(g,h);
  lVar5 = 0;
  bVar1 = false;
  bVar2 = false;
  do {
    if (inv == 0) {
      pNVar6 = (Node *)((long)h->node + lVar5);
    }
    else {
      pNVar6 = h->node + ((int)lVar4 - 1);
    }
    if (((pNVar6->u).tt_ & 0xf) == 0) {
      if (((pNVar6->u).key_tt & 0x40) != 0) {
        (pNVar6->u).key_tt = '\v';
      }
    }
    else {
      if (((pNVar6->u).key_tt & 0x40) == 0) {
        o = (GCObject *)0x0;
      }
      else {
        o = (pNVar6->u).key_val.gc;
      }
      iVar3 = iscleared(g,o);
      if (iVar3 == 0) {
        if ((((pNVar6->u).tt_ & 0x40) != 0) && (((*(GCObject **)pNVar6)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pNVar6);
          local_3c = 1;
        }
      }
      else {
        bVar1 = true;
        if ((((pNVar6->u).tt_ & 0x40) != 0) && ((((pNVar6->u).value_.gc)->marked & 0x18) != 0)) {
          bVar2 = true;
        }
      }
    }
    lVar5 = lVar5 + 0x18;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar2) {
    h->gclist = g->ephemeron;
    g->ephemeron = (GCObject *)h;
  }
  else {
    if (!bVar1) {
      genlink(g,(GCObject *)h);
      return local_3c;
    }
    h->gclist = g->allweak;
    g->allweak = (GCObject *)h;
  }
  h->marked = h->marked & 199;
  return local_3c;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int nsize = sizenode(h);
  int marked = traversearray(g, h);  /* traverse array part */
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}